

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_algor.c
# Opt level: O0

void X509_ALGOR_set_md(X509_ALGOR *alg,EVP_MD *md)

{
  int n;
  ASN1_OBJECT *aobj;
  int param_type;
  int local_14;
  
  if ((md->flags & 8) == 0) {
    local_14 = 5;
  }
  else {
    local_14 = -1;
  }
  n = EVP_MD_get_type((EVP_MD *)md);
  aobj = OBJ_nid2obj(n);
  X509_ALGOR_set0(alg,aobj,local_14,(void *)0x0);
  return;
}

Assistant:

void X509_ALGOR_set_md(X509_ALGOR *alg, const EVP_MD *md)
{
    int param_type;

    if (md->flags & EVP_MD_FLAG_DIGALGID_ABSENT)
        param_type = V_ASN1_UNDEF;
    else
        param_type = V_ASN1_NULL;

    X509_ALGOR_set0(alg, OBJ_nid2obj(EVP_MD_get_type(md)), param_type, NULL);

}